

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeSorterReset(sqlite3 *db,VdbeSorter *pSorter)

{
  u8 *p;
  sqlite3_file *psVar1;
  ulong uVar2;
  SortSubtask *pSVar3;
  
  vdbeSorterJoinAll(pSorter,0);
  if (pSorter->pReader != (PmaReader *)0x0) {
    vdbePmaReaderClear(pSorter->pReader);
    sqlite3DbFree(db,pSorter->pReader);
    pSorter->pReader = (PmaReader *)0x0;
  }
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = (MergeEngine *)0x0;
  pSVar3 = pSorter->aTask;
  for (uVar2 = 0; uVar2 < pSorter->nTask; uVar2 = uVar2 + 1) {
    sqlite3DbFree(db,pSVar3->pUnpacked);
    p = (pSVar3->list).aMemory;
    if (p == (u8 *)0x0) {
      vdbeSorterRecordFree((sqlite3 *)0x0,(pSVar3->list).pList);
    }
    else {
      sqlite3_free(p);
    }
    psVar1 = (pSVar3->file).pFd;
    if (psVar1 != (sqlite3_file *)0x0) {
      sqlite3OsCloseFree(psVar1);
    }
    psVar1 = (pSVar3->file2).pFd;
    if (psVar1 != (sqlite3_file *)0x0) {
      sqlite3OsCloseFree(psVar1);
    }
    pSVar3->pSorter = (VdbeSorter *)0x0;
    pSVar3->pUnpacked = (UnpackedRecord *)0x0;
    (pSVar3->file).iEof = 0;
    (pSVar3->file2).pFd = (sqlite3_file *)0x0;
    pSVar3->xCompare = (SorterCompare)0x0;
    (pSVar3->file).pFd = (sqlite3_file *)0x0;
    *(undefined8 *)&(pSVar3->list).szPMA = 0;
    *(undefined8 *)&pSVar3->nPMA = 0;
    (pSVar3->list).pList = (SorterRecord *)0x0;
    (pSVar3->list).aMemory = (u8 *)0x0;
    (pSVar3->file2).iEof = 0;
    pSVar3->pThread = (SQLiteThread *)0x0;
    *(undefined8 *)&pSVar3->bDone = 0;
    pSVar3->pSorter = pSorter;
    pSVar3 = pSVar3 + 1;
  }
  if ((pSorter->list).aMemory == (u8 *)0x0) {
    vdbeSorterRecordFree((sqlite3 *)0x0,(pSorter->list).pList);
  }
  (pSorter->list).pList = (SorterRecord *)0x0;
  (pSorter->list).szPMA = 0;
  pSorter->bUsePMA = '\0';
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db,pSorter->pUnpacked);
  pSorter->pUnpacked = (UnpackedRecord *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSorterReset(sqlite3 *db, VdbeSorter *pSorter){
  int i;
  (void)vdbeSorterJoinAll(pSorter, SQLITE_OK);
  assert( pSorter->bUseThreads || pSorter->pReader==0 );
#if SQLITE_MAX_WORKER_THREADS>0
  if( pSorter->pReader ){
    vdbePmaReaderClear(pSorter->pReader);
    sqlite3DbFree(db, pSorter->pReader);
    pSorter->pReader = 0;
  }
#endif
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = 0;
  for(i=0; i<pSorter->nTask; i++){
    SortSubtask *pTask = &pSorter->aTask[i];
    vdbeSortSubtaskCleanup(db, pTask);
    pTask->pSorter = pSorter;
  }
  if( pSorter->list.aMemory==0 ){
    vdbeSorterRecordFree(0, pSorter->list.pList);
  }
  pSorter->list.pList = 0;
  pSorter->list.szPMA = 0;
  pSorter->bUsePMA = 0;
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db, pSorter->pUnpacked);
  pSorter->pUnpacked = 0;
}